

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# biasmultiply.cc
# Opt level: O0

int main(int argc,char **argv)

{
  ostream *poVar1;
  ostream *poVar2;
  long in_RSI;
  int in_EDI;
  rep_conflict rVar3;
  int i_11;
  duration<double,_std::ratio<1L,_1L>_> newTimeAVX512VNNI;
  int i_10;
  duration<double,_std::ratio<1L,_1L>_> oldAVX512VNNI;
  int i_9;
  duration<double,_std::ratio<1L,_1L>_> oldAVX512VNNI_nobias;
  int i_8;
  duration<double,_std::ratio<1L,_1L>_> newTimeAVX512;
  int i_7;
  duration<double,_std::ratio<1L,_1L>_> oldAVX512;
  int i_6;
  duration<double,_std::ratio<1L,_1L>_> oldAVX512_nobias;
  int i_5;
  duration<double,_std::ratio<1L,_1L>_> newTimeAVX2;
  int i_4;
  duration<double,_std::ratio<1L,_1L>_> oldAVX2;
  int i_3;
  duration<double,_std::ratio<1L,_1L>_> oldAVX2_nobias;
  int i_2;
  duration<double,_std::ratio<1L,_1L>_> newTimeSSSE3;
  int i_1;
  duration<double,_std::ratio<1L,_1L>_> oldSSSE3;
  int i;
  duration<double,_std::ratio<1L,_1L>_> oldSSSE3_nobias;
  int repeat;
  Index in_stack_00001134;
  Index in_stack_00001138;
  Index in_stack_0000113c;
  Index in_stack_00001184;
  Index in_stack_00001188;
  Index in_stack_0000118c;
  Index in_stack_00001194;
  Index in_stack_00001198;
  Index in_stack_0000119c;
  Index in_stack_000011e4;
  Index in_stack_000011e8;
  Index in_stack_000011ec;
  duration<double,_std::ratio<1L,_1L>_> *in_stack_fffffffffffffc88;
  duration<double,_std::ratio<1L,_1L>_> *in_stack_fffffffffffffc90;
  int local_2e4;
  duration<double,_std::ratio<1L,_1L>_> local_2e0;
  rep_conflict local_2d8;
  rep_conflict local_2d0;
  rep_conflict local_2c8;
  rep_conflict local_2c0;
  rep_conflict local_2b8;
  rep_conflict local_2b0;
  int local_2a4;
  duration<double,_std::ratio<1L,_1L>_> local_2a0;
  rep_conflict local_298;
  rep_conflict local_290;
  rep_conflict local_288;
  rep_conflict local_280;
  rep_conflict local_278;
  rep_conflict local_270;
  int local_264;
  duration<double,_std::ratio<1L,_1L>_> local_260;
  rep_conflict local_258;
  rep_conflict local_250;
  rep_conflict local_248;
  rep_conflict local_240;
  rep_conflict local_238;
  rep_conflict local_230;
  int local_224;
  duration<double,_std::ratio<1L,_1L>_> local_220;
  rep_conflict local_218;
  rep_conflict local_210;
  rep_conflict local_208;
  rep_conflict local_200;
  rep_conflict local_1f8;
  rep_conflict local_1f0;
  int local_1e4;
  duration<double,_std::ratio<1L,_1L>_> local_1e0;
  rep_conflict local_1d8;
  rep_conflict local_1d0;
  rep_conflict local_1c8;
  rep_conflict local_1c0;
  rep_conflict local_1b8;
  rep_conflict local_1b0;
  int local_1a4;
  duration<double,_std::ratio<1L,_1L>_> local_1a0;
  rep_conflict local_198;
  rep_conflict local_190;
  rep_conflict local_188;
  rep_conflict local_180;
  rep_conflict local_178;
  rep_conflict local_170;
  int local_164;
  duration<double,_std::ratio<1L,_1L>_> local_160;
  rep_conflict local_158;
  rep_conflict local_150;
  rep_conflict local_148;
  rep_conflict local_140;
  rep_conflict local_138;
  rep_conflict local_130;
  int local_124;
  duration<double,_std::ratio<1L,_1L>_> local_120;
  rep_conflict local_118;
  rep_conflict local_110;
  rep_conflict local_108;
  rep_conflict local_100;
  rep_conflict local_f8;
  rep_conflict local_f0;
  int local_e4;
  duration<double,_std::ratio<1L,_1L>_> local_e0;
  rep_conflict local_d8;
  rep_conflict local_d0;
  rep_conflict local_c8;
  rep_conflict local_c0;
  rep_conflict local_b8;
  rep_conflict local_b0;
  int local_a4;
  duration<double,_std::ratio<1L,_1L>_> local_a0;
  rep_conflict local_98;
  rep_conflict local_90;
  rep_conflict local_88;
  rep_conflict local_80;
  rep_conflict local_78;
  rep_conflict local_70;
  int local_64;
  duration<double,_std::ratio<1L,_1L>_> local_60;
  rep_conflict local_58;
  rep_conflict local_50;
  rep_conflict local_48;
  rep_conflict local_40;
  rep_conflict local_38;
  rep_conflict local_30;
  int local_24;
  duration<double,_std::ratio<1L,_1L>_> local_20;
  int local_14;
  int local_4;
  
  local_4 = 0;
  local_14 = 1000;
  if (1 < in_EDI) {
    local_14 = atoi(*(char **)(in_RSI + 8));
  }
  local_20 = testOld_nobias<intgemm::SSSE3::Kernels8>
                       (in_stack_0000118c,in_stack_00001188,in_stack_00001184);
  for (local_24 = 0; local_24 < local_14; local_24 = local_24 + 1) {
    local_30 = (rep_conflict)
               testOld_nobias<intgemm::SSSE3::Kernels8>
                         (in_stack_0000118c,in_stack_00001188,in_stack_00001184);
    std::chrono::duration<double,_std::ratio<1L,_1L>_>::operator+=
              (in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
    local_38 = (rep_conflict)
               testOld_nobias<intgemm::SSSE3::Kernels8>
                         (in_stack_0000118c,in_stack_00001188,in_stack_00001184);
    std::chrono::duration<double,_std::ratio<1L,_1L>_>::operator+=
              (in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
    local_40 = (rep_conflict)
               testOld_nobias<intgemm::SSSE3::Kernels8>
                         (in_stack_0000118c,in_stack_00001188,in_stack_00001184);
    std::chrono::duration<double,_std::ratio<1L,_1L>_>::operator+=
              (in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
    local_48 = (rep_conflict)
               testOld_nobias<intgemm::SSSE3::Kernels8>
                         (in_stack_0000118c,in_stack_00001188,in_stack_00001184);
    std::chrono::duration<double,_std::ratio<1L,_1L>_>::operator+=
              (in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
    local_50 = (rep_conflict)
               testOld_nobias<intgemm::SSSE3::Kernels8>
                         (in_stack_0000118c,in_stack_00001188,in_stack_00001184);
    std::chrono::duration<double,_std::ratio<1L,_1L>_>::operator+=
              (in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
    local_58 = (rep_conflict)
               testOld_nobias<intgemm::SSSE3::Kernels8>
                         (in_stack_0000118c,in_stack_00001188,in_stack_00001184);
    std::chrono::duration<double,_std::ratio<1L,_1L>_>::operator+=
              (in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
  }
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_14);
  poVar1 = std::operator<<(poVar1," iterations of SSSE3 without bias took: ");
  rVar3 = std::chrono::duration<double,_std::ratio<1L,_1L>_>::count(&local_20);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,rVar3);
  poVar1 = std::operator<<(poVar1," seconds.");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  local_60 = testOld<intgemm::SSSE3::Kernels8>
                       (in_stack_0000119c,in_stack_00001198,in_stack_00001194);
  for (local_64 = 0; local_64 < local_14; local_64 = local_64 + 1) {
    local_70 = (rep_conflict)
               testOld<intgemm::SSSE3::Kernels8>
                         (in_stack_0000119c,in_stack_00001198,in_stack_00001194);
    std::chrono::duration<double,_std::ratio<1L,_1L>_>::operator+=
              (in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
    local_78 = (rep_conflict)
               testOld<intgemm::SSSE3::Kernels8>
                         (in_stack_0000119c,in_stack_00001198,in_stack_00001194);
    std::chrono::duration<double,_std::ratio<1L,_1L>_>::operator+=
              (in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
    local_80 = (rep_conflict)
               testOld<intgemm::SSSE3::Kernels8>
                         (in_stack_0000119c,in_stack_00001198,in_stack_00001194);
    std::chrono::duration<double,_std::ratio<1L,_1L>_>::operator+=
              (in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
    local_88 = (rep_conflict)
               testOld<intgemm::SSSE3::Kernels8>
                         (in_stack_0000119c,in_stack_00001198,in_stack_00001194);
    std::chrono::duration<double,_std::ratio<1L,_1L>_>::operator+=
              (in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
    local_90 = (rep_conflict)
               testOld<intgemm::SSSE3::Kernels8>
                         (in_stack_0000119c,in_stack_00001198,in_stack_00001194);
    std::chrono::duration<double,_std::ratio<1L,_1L>_>::operator+=
              (in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
    local_98 = (rep_conflict)
               testOld<intgemm::SSSE3::Kernels8>
                         (in_stack_0000119c,in_stack_00001198,in_stack_00001194);
    std::chrono::duration<double,_std::ratio<1L,_1L>_>::operator+=
              (in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
  }
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_14);
  poVar1 = std::operator<<(poVar1," iterations of SSSE3 took: ");
  rVar3 = std::chrono::duration<double,_std::ratio<1L,_1L>_>::count(&local_60);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,rVar3);
  poVar1 = std::operator<<(poVar1," seconds.");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  local_a0 = testOld<intgemm::SSSE3::Kernels8>
                       (in_stack_0000119c,in_stack_00001198,in_stack_00001194);
  for (local_a4 = 0; local_a4 < local_14; local_a4 = local_a4 + 1) {
    local_b0 = (rep_conflict)
               testNew<intgemm::SSSE3::Kernels8>
                         (in_stack_000011ec,in_stack_000011e8,in_stack_000011e4);
    std::chrono::duration<double,_std::ratio<1L,_1L>_>::operator+=
              (in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
    local_b8 = (rep_conflict)
               testNew<intgemm::SSSE3::Kernels8>
                         (in_stack_000011ec,in_stack_000011e8,in_stack_000011e4);
    std::chrono::duration<double,_std::ratio<1L,_1L>_>::operator+=
              (in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
    local_c0 = (rep_conflict)
               testNew<intgemm::SSSE3::Kernels8>
                         (in_stack_000011ec,in_stack_000011e8,in_stack_000011e4);
    std::chrono::duration<double,_std::ratio<1L,_1L>_>::operator+=
              (in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
    local_c8 = (rep_conflict)
               testNew<intgemm::SSSE3::Kernels8>
                         (in_stack_000011ec,in_stack_000011e8,in_stack_000011e4);
    std::chrono::duration<double,_std::ratio<1L,_1L>_>::operator+=
              (in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
    local_d0 = (rep_conflict)
               testNew<intgemm::SSSE3::Kernels8>
                         (in_stack_000011ec,in_stack_000011e8,in_stack_000011e4);
    std::chrono::duration<double,_std::ratio<1L,_1L>_>::operator+=
              (in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
    local_d8 = (rep_conflict)
               testNew<intgemm::SSSE3::Kernels8>
                         (in_stack_000011ec,in_stack_000011e8,in_stack_000011e4);
    std::chrono::duration<double,_std::ratio<1L,_1L>_>::operator+=
              (in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
  }
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_14);
  poVar1 = std::operator<<(poVar1," iterations of Shifted SSSE3 took: ");
  rVar3 = std::chrono::duration<double,_std::ratio<1L,_1L>_>::count(&local_a0);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,rVar3);
  poVar1 = std::operator<<(poVar1," seconds.");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  local_e0 = testOld_nobias<intgemm::AVX2::Kernels8>
                       (in_stack_0000113c,in_stack_00001138,in_stack_00001134);
  for (local_e4 = 0; local_e4 < local_14; local_e4 = local_e4 + 1) {
    local_f0 = (rep_conflict)
               testOld_nobias<intgemm::AVX2::Kernels8>
                         (in_stack_0000113c,in_stack_00001138,in_stack_00001134);
    std::chrono::duration<double,_std::ratio<1L,_1L>_>::operator+=
              (in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
    local_f8 = (rep_conflict)
               testOld_nobias<intgemm::AVX2::Kernels8>
                         (in_stack_0000113c,in_stack_00001138,in_stack_00001134);
    std::chrono::duration<double,_std::ratio<1L,_1L>_>::operator+=
              (in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
    local_100 = (rep_conflict)
                testOld_nobias<intgemm::AVX2::Kernels8>
                          (in_stack_0000113c,in_stack_00001138,in_stack_00001134);
    std::chrono::duration<double,_std::ratio<1L,_1L>_>::operator+=
              (in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
    local_108 = (rep_conflict)
                testOld_nobias<intgemm::AVX2::Kernels8>
                          (in_stack_0000113c,in_stack_00001138,in_stack_00001134);
    std::chrono::duration<double,_std::ratio<1L,_1L>_>::operator+=
              (in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
    local_110 = (rep_conflict)
                testOld_nobias<intgemm::AVX2::Kernels8>
                          (in_stack_0000113c,in_stack_00001138,in_stack_00001134);
    std::chrono::duration<double,_std::ratio<1L,_1L>_>::operator+=
              (in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
    local_118 = (rep_conflict)
                testOld_nobias<intgemm::AVX2::Kernels8>
                          (in_stack_0000113c,in_stack_00001138,in_stack_00001134);
    std::chrono::duration<double,_std::ratio<1L,_1L>_>::operator+=
              (in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
  }
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_14);
  poVar1 = std::operator<<(poVar1," iterations of AVX2 without bias took: ");
  rVar3 = std::chrono::duration<double,_std::ratio<1L,_1L>_>::count(&local_e0);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,rVar3);
  poVar1 = std::operator<<(poVar1," seconds.");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  local_120 = testOld<intgemm::AVX2::Kernels8>
                        (in_stack_0000119c,in_stack_00001198,in_stack_00001194);
  for (local_124 = 0; local_124 < local_14; local_124 = local_124 + 1) {
    local_130 = (rep_conflict)
                testOld<intgemm::AVX2::Kernels8>
                          (in_stack_0000119c,in_stack_00001198,in_stack_00001194);
    std::chrono::duration<double,_std::ratio<1L,_1L>_>::operator+=
              (in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
    local_138 = (rep_conflict)
                testOld<intgemm::AVX2::Kernels8>
                          (in_stack_0000119c,in_stack_00001198,in_stack_00001194);
    std::chrono::duration<double,_std::ratio<1L,_1L>_>::operator+=
              (in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
    local_140 = (rep_conflict)
                testOld<intgemm::AVX2::Kernels8>
                          (in_stack_0000119c,in_stack_00001198,in_stack_00001194);
    std::chrono::duration<double,_std::ratio<1L,_1L>_>::operator+=
              (in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
    local_148 = (rep_conflict)
                testOld<intgemm::AVX2::Kernels8>
                          (in_stack_0000119c,in_stack_00001198,in_stack_00001194);
    std::chrono::duration<double,_std::ratio<1L,_1L>_>::operator+=
              (in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
    local_150 = (rep_conflict)
                testOld<intgemm::AVX2::Kernels8>
                          (in_stack_0000119c,in_stack_00001198,in_stack_00001194);
    std::chrono::duration<double,_std::ratio<1L,_1L>_>::operator+=
              (in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
    local_158 = (rep_conflict)
                testOld<intgemm::AVX2::Kernels8>
                          (in_stack_0000119c,in_stack_00001198,in_stack_00001194);
    std::chrono::duration<double,_std::ratio<1L,_1L>_>::operator+=
              (in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
  }
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_14);
  poVar1 = std::operator<<(poVar1," iterations of AVX2 took: ");
  rVar3 = std::chrono::duration<double,_std::ratio<1L,_1L>_>::count(&local_120);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,rVar3);
  poVar1 = std::operator<<(poVar1," seconds.");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  local_160 = testOld<intgemm::AVX2::Kernels8>
                        (in_stack_0000119c,in_stack_00001198,in_stack_00001194);
  for (local_164 = 0; local_164 < local_14; local_164 = local_164 + 1) {
    local_170 = (rep_conflict)
                testNew<intgemm::AVX2::Kernels8>
                          (in_stack_000011ec,in_stack_000011e8,in_stack_000011e4);
    std::chrono::duration<double,_std::ratio<1L,_1L>_>::operator+=
              (in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
    local_178 = (rep_conflict)
                testNew<intgemm::AVX2::Kernels8>
                          (in_stack_000011ec,in_stack_000011e8,in_stack_000011e4);
    std::chrono::duration<double,_std::ratio<1L,_1L>_>::operator+=
              (in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
    local_180 = (rep_conflict)
                testNew<intgemm::AVX2::Kernels8>
                          (in_stack_000011ec,in_stack_000011e8,in_stack_000011e4);
    std::chrono::duration<double,_std::ratio<1L,_1L>_>::operator+=
              (in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
    local_188 = (rep_conflict)
                testNew<intgemm::AVX2::Kernels8>
                          (in_stack_000011ec,in_stack_000011e8,in_stack_000011e4);
    std::chrono::duration<double,_std::ratio<1L,_1L>_>::operator+=
              (in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
    local_190 = (rep_conflict)
                testNew<intgemm::AVX2::Kernels8>
                          (in_stack_000011ec,in_stack_000011e8,in_stack_000011e4);
    std::chrono::duration<double,_std::ratio<1L,_1L>_>::operator+=
              (in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
    local_198 = (rep_conflict)
                testNew<intgemm::AVX2::Kernels8>
                          (in_stack_000011ec,in_stack_000011e8,in_stack_000011e4);
    std::chrono::duration<double,_std::ratio<1L,_1L>_>::operator+=
              (in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
  }
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_14);
  poVar1 = std::operator<<(poVar1," iterations of Shifted AVX2 took: ");
  rVar3 = std::chrono::duration<double,_std::ratio<1L,_1L>_>::count(&local_160);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,rVar3);
  poVar1 = std::operator<<(poVar1," seconds.");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  if (intgemm::kCPU < 4) {
    local_4 = 0;
  }
  else {
    local_1a0 = testOld_nobias<intgemm::AVX512BW::Kernels8>
                          (in_stack_0000113c,in_stack_00001138,in_stack_00001134);
    for (local_1a4 = 0; local_1a4 < local_14; local_1a4 = local_1a4 + 1) {
      local_1b0 = (rep_conflict)
                  testOld_nobias<intgemm::AVX512BW::Kernels8>
                            (in_stack_0000113c,in_stack_00001138,in_stack_00001134);
      std::chrono::duration<double,_std::ratio<1L,_1L>_>::operator+=
                (in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
      local_1b8 = (rep_conflict)
                  testOld_nobias<intgemm::AVX512BW::Kernels8>
                            (in_stack_0000113c,in_stack_00001138,in_stack_00001134);
      std::chrono::duration<double,_std::ratio<1L,_1L>_>::operator+=
                (in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
      local_1c0 = (rep_conflict)
                  testOld_nobias<intgemm::AVX512BW::Kernels8>
                            (in_stack_0000113c,in_stack_00001138,in_stack_00001134);
      std::chrono::duration<double,_std::ratio<1L,_1L>_>::operator+=
                (in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
      local_1c8 = (rep_conflict)
                  testOld_nobias<intgemm::AVX512BW::Kernels8>
                            (in_stack_0000113c,in_stack_00001138,in_stack_00001134);
      std::chrono::duration<double,_std::ratio<1L,_1L>_>::operator+=
                (in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
      local_1d0 = (rep_conflict)
                  testOld_nobias<intgemm::AVX512BW::Kernels8>
                            (in_stack_0000113c,in_stack_00001138,in_stack_00001134);
      std::chrono::duration<double,_std::ratio<1L,_1L>_>::operator+=
                (in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
      local_1d8 = (rep_conflict)
                  testOld_nobias<intgemm::AVX512BW::Kernels8>
                            (in_stack_0000113c,in_stack_00001138,in_stack_00001134);
      std::chrono::duration<double,_std::ratio<1L,_1L>_>::operator+=
                (in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
    }
    poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_14);
    poVar1 = std::operator<<(poVar1," iterations of AVX512 without bias took: ");
    rVar3 = std::chrono::duration<double,_std::ratio<1L,_1L>_>::count(&local_1a0);
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,rVar3);
    poVar1 = std::operator<<(poVar1," seconds.");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    local_1e0 = testOld<intgemm::AVX512BW::Kernels8>
                          (in_stack_0000119c,in_stack_00001198,in_stack_00001194);
    for (local_1e4 = 0; local_1e4 < local_14; local_1e4 = local_1e4 + 1) {
      local_1f0 = (rep_conflict)
                  testOld<intgemm::AVX512BW::Kernels8>
                            (in_stack_0000119c,in_stack_00001198,in_stack_00001194);
      std::chrono::duration<double,_std::ratio<1L,_1L>_>::operator+=
                (in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
      local_1f8 = (rep_conflict)
                  testOld<intgemm::AVX512BW::Kernels8>
                            (in_stack_0000119c,in_stack_00001198,in_stack_00001194);
      std::chrono::duration<double,_std::ratio<1L,_1L>_>::operator+=
                (in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
      local_200 = (rep_conflict)
                  testOld<intgemm::AVX512BW::Kernels8>
                            (in_stack_0000119c,in_stack_00001198,in_stack_00001194);
      std::chrono::duration<double,_std::ratio<1L,_1L>_>::operator+=
                (in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
      local_208 = (rep_conflict)
                  testOld<intgemm::AVX512BW::Kernels8>
                            (in_stack_0000119c,in_stack_00001198,in_stack_00001194);
      std::chrono::duration<double,_std::ratio<1L,_1L>_>::operator+=
                (in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
      local_210 = (rep_conflict)
                  testOld<intgemm::AVX512BW::Kernels8>
                            (in_stack_0000119c,in_stack_00001198,in_stack_00001194);
      std::chrono::duration<double,_std::ratio<1L,_1L>_>::operator+=
                (in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
      local_218 = (rep_conflict)
                  testOld<intgemm::AVX512BW::Kernels8>
                            (in_stack_0000119c,in_stack_00001198,in_stack_00001194);
      std::chrono::duration<double,_std::ratio<1L,_1L>_>::operator+=
                (in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
    }
    poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_14);
    poVar1 = std::operator<<(poVar1," iterations of AVX512 took: ");
    rVar3 = std::chrono::duration<double,_std::ratio<1L,_1L>_>::count(&local_1e0);
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,rVar3);
    poVar1 = std::operator<<(poVar1," seconds.");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    local_220 = testOld<intgemm::AVX512BW::Kernels8>
                          (in_stack_0000119c,in_stack_00001198,in_stack_00001194);
    for (local_224 = 0; local_224 < local_14; local_224 = local_224 + 1) {
      local_230 = (rep_conflict)
                  testNew<intgemm::AVX512BW::Kernels8>
                            (in_stack_000011ec,in_stack_000011e8,in_stack_000011e4);
      std::chrono::duration<double,_std::ratio<1L,_1L>_>::operator+=
                (in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
      local_238 = (rep_conflict)
                  testNew<intgemm::AVX512BW::Kernels8>
                            (in_stack_000011ec,in_stack_000011e8,in_stack_000011e4);
      std::chrono::duration<double,_std::ratio<1L,_1L>_>::operator+=
                (in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
      local_240 = (rep_conflict)
                  testNew<intgemm::AVX512BW::Kernels8>
                            (in_stack_000011ec,in_stack_000011e8,in_stack_000011e4);
      std::chrono::duration<double,_std::ratio<1L,_1L>_>::operator+=
                (in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
      local_248 = (rep_conflict)
                  testNew<intgemm::AVX512BW::Kernels8>
                            (in_stack_000011ec,in_stack_000011e8,in_stack_000011e4);
      std::chrono::duration<double,_std::ratio<1L,_1L>_>::operator+=
                (in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
      local_250 = (rep_conflict)
                  testNew<intgemm::AVX512BW::Kernels8>
                            (in_stack_000011ec,in_stack_000011e8,in_stack_000011e4);
      std::chrono::duration<double,_std::ratio<1L,_1L>_>::operator+=
                (in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
      local_258 = (rep_conflict)
                  testNew<intgemm::AVX512BW::Kernels8>
                            (in_stack_000011ec,in_stack_000011e8,in_stack_000011e4);
      std::chrono::duration<double,_std::ratio<1L,_1L>_>::operator+=
                (in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
    }
    poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_14);
    poVar1 = std::operator<<(poVar1," iterations of Shifted AVX512 took: ");
    rVar3 = std::chrono::duration<double,_std::ratio<1L,_1L>_>::count(&local_220);
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,rVar3);
    poVar1 = std::operator<<(poVar1," seconds.");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    if (intgemm::kCPU < 5) {
      local_4 = 0;
    }
    else {
      local_260 = testOld_nobias<intgemm::AVX512BW::Kernels8>
                            (in_stack_0000113c,in_stack_00001138,in_stack_00001134);
      for (local_264 = 0; local_264 < local_14; local_264 = local_264 + 1) {
        local_270 = (rep_conflict)
                    testOld_nobias<intgemm::AVX512VNNI::Kernels8>
                              (in_stack_0000113c,in_stack_00001138,in_stack_00001134);
        std::chrono::duration<double,_std::ratio<1L,_1L>_>::operator+=
                  (in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
        local_278 = (rep_conflict)
                    testOld_nobias<intgemm::AVX512VNNI::Kernels8>
                              (in_stack_0000113c,in_stack_00001138,in_stack_00001134);
        std::chrono::duration<double,_std::ratio<1L,_1L>_>::operator+=
                  (in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
        local_280 = (rep_conflict)
                    testOld_nobias<intgemm::AVX512VNNI::Kernels8>
                              (in_stack_0000113c,in_stack_00001138,in_stack_00001134);
        std::chrono::duration<double,_std::ratio<1L,_1L>_>::operator+=
                  (in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
        local_288 = (rep_conflict)
                    testOld_nobias<intgemm::AVX512VNNI::Kernels8>
                              (in_stack_0000113c,in_stack_00001138,in_stack_00001134);
        std::chrono::duration<double,_std::ratio<1L,_1L>_>::operator+=
                  (in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
        local_290 = (rep_conflict)
                    testOld_nobias<intgemm::AVX512VNNI::Kernels8>
                              (in_stack_0000113c,in_stack_00001138,in_stack_00001134);
        std::chrono::duration<double,_std::ratio<1L,_1L>_>::operator+=
                  (in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
        local_298 = (rep_conflict)
                    testOld_nobias<intgemm::AVX512VNNI::Kernels8>
                              (in_stack_0000113c,in_stack_00001138,in_stack_00001134);
        std::chrono::duration<double,_std::ratio<1L,_1L>_>::operator+=
                  (in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
      }
      poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_14);
      poVar1 = std::operator<<(poVar1," iterations of AVX512VNNI without bias took: ");
      rVar3 = std::chrono::duration<double,_std::ratio<1L,_1L>_>::count(&local_260);
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,rVar3);
      poVar1 = std::operator<<(poVar1," seconds.");
      std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
      local_2a0 = testOld<intgemm::AVX512BW::Kernels8>
                            (in_stack_0000119c,in_stack_00001198,in_stack_00001194);
      for (local_2a4 = 0; local_2a4 < local_14; local_2a4 = local_2a4 + 1) {
        local_2b0 = (rep_conflict)
                    testOld<intgemm::AVX512VNNI::Kernels8>
                              (in_stack_0000119c,in_stack_00001198,in_stack_00001194);
        std::chrono::duration<double,_std::ratio<1L,_1L>_>::operator+=
                  (in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
        local_2b8 = (rep_conflict)
                    testOld<intgemm::AVX512VNNI::Kernels8>
                              (in_stack_0000119c,in_stack_00001198,in_stack_00001194);
        std::chrono::duration<double,_std::ratio<1L,_1L>_>::operator+=
                  (in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
        local_2c0 = (rep_conflict)
                    testOld<intgemm::AVX512VNNI::Kernels8>
                              (in_stack_0000119c,in_stack_00001198,in_stack_00001194);
        std::chrono::duration<double,_std::ratio<1L,_1L>_>::operator+=
                  (in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
        local_2c8 = (rep_conflict)
                    testOld<intgemm::AVX512VNNI::Kernels8>
                              (in_stack_0000119c,in_stack_00001198,in_stack_00001194);
        std::chrono::duration<double,_std::ratio<1L,_1L>_>::operator+=
                  (in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
        local_2d0 = (rep_conflict)
                    testOld<intgemm::AVX512VNNI::Kernels8>
                              (in_stack_0000119c,in_stack_00001198,in_stack_00001194);
        std::chrono::duration<double,_std::ratio<1L,_1L>_>::operator+=
                  (in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
        local_2d8 = (rep_conflict)
                    testOld<intgemm::AVX512VNNI::Kernels8>
                              (in_stack_0000119c,in_stack_00001198,in_stack_00001194);
        std::chrono::duration<double,_std::ratio<1L,_1L>_>::operator+=
                  (in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
      }
      poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_14);
      poVar1 = std::operator<<(poVar1," iterations of AVX512VNNI took: ");
      rVar3 = std::chrono::duration<double,_std::ratio<1L,_1L>_>::count(&local_2a0);
      poVar2 = (ostream *)std::ostream::operator<<(poVar1,rVar3);
      poVar2 = std::operator<<(poVar2," seconds.");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      local_2e0 = testOld<intgemm::AVX512BW::Kernels8>
                            (in_stack_0000119c,in_stack_00001198,in_stack_00001194);
      for (local_2e4 = 0; local_2e4 < local_14; local_2e4 = local_2e4 + 1) {
        testNew<intgemm::AVX512VNNI::Kernels8>
                  (in_stack_000011ec,in_stack_000011e8,in_stack_000011e4);
        std::chrono::duration<double,_std::ratio<1L,_1L>_>::operator+=
                  ((duration<double,_std::ratio<1L,_1L>_> *)poVar1,in_stack_fffffffffffffc88);
        testNew<intgemm::AVX512VNNI::Kernels8>
                  (in_stack_000011ec,in_stack_000011e8,in_stack_000011e4);
        std::chrono::duration<double,_std::ratio<1L,_1L>_>::operator+=
                  ((duration<double,_std::ratio<1L,_1L>_> *)poVar1,in_stack_fffffffffffffc88);
        testNew<intgemm::AVX512VNNI::Kernels8>
                  (in_stack_000011ec,in_stack_000011e8,in_stack_000011e4);
        std::chrono::duration<double,_std::ratio<1L,_1L>_>::operator+=
                  ((duration<double,_std::ratio<1L,_1L>_> *)poVar1,in_stack_fffffffffffffc88);
        testNew<intgemm::AVX512VNNI::Kernels8>
                  (in_stack_000011ec,in_stack_000011e8,in_stack_000011e4);
        std::chrono::duration<double,_std::ratio<1L,_1L>_>::operator+=
                  ((duration<double,_std::ratio<1L,_1L>_> *)poVar1,in_stack_fffffffffffffc88);
        testNew<intgemm::AVX512VNNI::Kernels8>
                  (in_stack_000011ec,in_stack_000011e8,in_stack_000011e4);
        std::chrono::duration<double,_std::ratio<1L,_1L>_>::operator+=
                  ((duration<double,_std::ratio<1L,_1L>_> *)poVar1,in_stack_fffffffffffffc88);
        testNew<intgemm::AVX512VNNI::Kernels8>
                  (in_stack_000011ec,in_stack_000011e8,in_stack_000011e4);
        std::chrono::duration<double,_std::ratio<1L,_1L>_>::operator+=
                  ((duration<double,_std::ratio<1L,_1L>_> *)poVar1,in_stack_fffffffffffffc88);
      }
      poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_14);
      poVar1 = std::operator<<(poVar1," iterations of Shifted AVX512VNNI took: ");
      rVar3 = std::chrono::duration<double,_std::ratio<1L,_1L>_>::count(&local_2e0);
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,rVar3);
      poVar1 = std::operator<<(poVar1," seconds.");
      std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    }
  }
  return local_4;
}

Assistant:

int main(int argc, char ** argv) {
	int repeat = 1000;
	if (argc > 1) {
		repeat = atoi(argv[1]);
	}

	std::chrono::duration<double> oldSSSE3_nobias = testOld_nobias<SSSE3::Kernels8>(1, 64, 8);
	for (int i = 0; i<repeat; i++) {
		oldSSSE3_nobias += testOld_nobias<SSSE3::Kernels8>(8, 256, 256);
		oldSSSE3_nobias += testOld_nobias<SSSE3::Kernels8>(8, 2048, 256);
		oldSSSE3_nobias += testOld_nobias<SSSE3::Kernels8>(320, 256, 256);
		oldSSSE3_nobias += testOld_nobias<SSSE3::Kernels8>(472, 256, 256);
		oldSSSE3_nobias += testOld_nobias<SSSE3::Kernels8>(248, 256, 256);
		oldSSSE3_nobias += testOld_nobias<SSSE3::Kernels8>(200, 256, 256);
	}

	std::cout << repeat << " iterations of SSSE3 without bias took: " << oldSSSE3_nobias.count() << " seconds." << std::endl;

	std::chrono::duration<double> oldSSSE3 = testOld<SSSE3::Kernels8>(1, 64, 8);
	for (int i = 0; i<repeat; i++) {
		oldSSSE3 += testOld<SSSE3::Kernels8>(8, 256, 256);
		oldSSSE3 += testOld<SSSE3::Kernels8>(8, 2048, 256);
		oldSSSE3 += testOld<SSSE3::Kernels8>(320, 256, 256);
		oldSSSE3 += testOld<SSSE3::Kernels8>(472, 256, 256);
		oldSSSE3 += testOld<SSSE3::Kernels8>(248, 256, 256);
		oldSSSE3 += testOld<SSSE3::Kernels8>(200, 256, 256);
	}

	std::cout << repeat << " iterations of SSSE3 took: " << oldSSSE3.count() << " seconds." << std::endl;

	std::chrono::duration<double> newTimeSSSE3 = testOld<SSSE3::Kernels8>(1, 64, 8);
	for (int i = 0; i<repeat; i++) {
		newTimeSSSE3 += testNew<SSSE3::Kernels8>(8, 256, 256);
		newTimeSSSE3 += testNew<SSSE3::Kernels8>(8, 2048, 256);
		newTimeSSSE3 += testNew<SSSE3::Kernels8>(320, 256, 256);
		newTimeSSSE3 += testNew<SSSE3::Kernels8>(472, 256, 256);
		newTimeSSSE3 += testNew<SSSE3::Kernels8>(248, 256, 256);
		newTimeSSSE3 += testNew<SSSE3::Kernels8>(200, 256, 256);
	}

	std::cout << repeat << " iterations of Shifted SSSE3 took: " << newTimeSSSE3.count() << " seconds." << std::endl;

#ifdef INTGEMM_COMPILER_SUPPORTS_AVX2
	std::chrono::duration<double> oldAVX2_nobias = testOld_nobias<AVX2::Kernels8>(1, 64, 8);
	for (int i = 0; i<repeat; i++) {
		oldAVX2_nobias += testOld_nobias<AVX2::Kernels8>(8, 256, 256);
		oldAVX2_nobias += testOld_nobias<AVX2::Kernels8>(8, 2048, 256);
		oldAVX2_nobias += testOld_nobias<AVX2::Kernels8>(320, 256, 256);
		oldAVX2_nobias += testOld_nobias<AVX2::Kernels8>(472, 256, 256);
		oldAVX2_nobias += testOld_nobias<AVX2::Kernels8>(248, 256, 256);
		oldAVX2_nobias += testOld_nobias<AVX2::Kernels8>(200, 256, 256);
	}

	std::cout << repeat << " iterations of AVX2 without bias took: " << oldAVX2_nobias.count() << " seconds." << std::endl;

	std::chrono::duration<double> oldAVX2 = testOld<AVX2::Kernels8>(1, 64, 8);
	for (int i = 0; i<repeat; i++) {
		oldAVX2 += testOld<AVX2::Kernels8>(8, 256, 256);
		oldAVX2 += testOld<AVX2::Kernels8>(8, 2048, 256);
		oldAVX2 += testOld<AVX2::Kernels8>(320, 256, 256);
		oldAVX2 += testOld<AVX2::Kernels8>(472, 256, 256);
		oldAVX2 += testOld<AVX2::Kernels8>(248, 256, 256);
		oldAVX2 += testOld<AVX2::Kernels8>(200, 256, 256);
	}

	std::cout << repeat << " iterations of AVX2 took: " << oldAVX2.count() << " seconds." << std::endl;

	std::chrono::duration<double> newTimeAVX2 = testOld<AVX2::Kernels8>(1, 64, 8);
	for (int i = 0; i<repeat; i++) {
		newTimeAVX2 += testNew<AVX2::Kernels8>(8, 256, 256);
		newTimeAVX2 += testNew<AVX2::Kernels8>(8, 2048, 256);
		newTimeAVX2 += testNew<AVX2::Kernels8>(320, 256, 256);
		newTimeAVX2 += testNew<AVX2::Kernels8>(472, 256, 256);
		newTimeAVX2 += testNew<AVX2::Kernels8>(248, 256, 256);
		newTimeAVX2 += testNew<AVX2::Kernels8>(200, 256, 256);
	}

	std::cout << repeat << " iterations of Shifted AVX2 took: " << newTimeAVX2.count() << " seconds." << std::endl;
#endif
#ifdef INTGEMM_COMPILER_SUPPORTS_AVX512BW
	if (kCPU < CPUType::AVX512BW) return 0;
	std::chrono::duration<double> oldAVX512_nobias = testOld_nobias<AVX512BW::Kernels8>(1, 64, 8);
	for (int i = 0; i<repeat; i++) {
		oldAVX512_nobias += testOld_nobias<AVX512BW::Kernels8>(8, 256, 256);
		oldAVX512_nobias += testOld_nobias<AVX512BW::Kernels8>(8, 2048, 256);
		oldAVX512_nobias += testOld_nobias<AVX512BW::Kernels8>(320, 256, 256);
		oldAVX512_nobias += testOld_nobias<AVX512BW::Kernels8>(472, 256, 256);
		oldAVX512_nobias += testOld_nobias<AVX512BW::Kernels8>(248, 256, 256);
		oldAVX512_nobias += testOld_nobias<AVX512BW::Kernels8>(200, 256, 256);
	}

	std::cout << repeat << " iterations of AVX512 without bias took: " << oldAVX512_nobias.count() << " seconds." << std::endl;

	std::chrono::duration<double> oldAVX512 = testOld<AVX512BW::Kernels8>(1, 64, 8);
	for (int i = 0; i<repeat; i++) {
		oldAVX512 += testOld<AVX512BW::Kernels8>(8, 256, 256);
		oldAVX512 += testOld<AVX512BW::Kernels8>(8, 2048, 256);
		oldAVX512 += testOld<AVX512BW::Kernels8>(320, 256, 256);
		oldAVX512 += testOld<AVX512BW::Kernels8>(472, 256, 256);
		oldAVX512 += testOld<AVX512BW::Kernels8>(248, 256, 256);
		oldAVX512 += testOld<AVX512BW::Kernels8>(200, 256, 256);
	}

	std::cout << repeat << " iterations of AVX512 took: " << oldAVX512.count() << " seconds." << std::endl;

	std::chrono::duration<double> newTimeAVX512 = testOld<AVX512BW::Kernels8>(1, 64, 8);
	for (int i = 0; i<repeat; i++) {
		newTimeAVX512 += testNew<AVX512BW::Kernels8>(8, 256, 256);
		newTimeAVX512 += testNew<AVX512BW::Kernels8>(8, 2048, 256);
		newTimeAVX512 += testNew<AVX512BW::Kernels8>(320, 256, 256);
		newTimeAVX512 += testNew<AVX512BW::Kernels8>(472, 256, 256);
		newTimeAVX512 += testNew<AVX512BW::Kernels8>(248, 256, 256);
		newTimeAVX512 += testNew<AVX512BW::Kernels8>(200, 256, 256);
	}

	std::cout << repeat << " iterations of Shifted AVX512 took: " << newTimeAVX512.count() << " seconds." << std::endl;
#endif
#ifdef INTGEMM_COMPILER_SUPPORTS_AVX512VNNI
  if (kCPU < CPUType::AVX512VNNI) return 0;
  std::chrono::duration<double> oldAVX512VNNI_nobias = testOld_nobias<AVX512BW::Kernels8>(1, 64, 8);
  for (int i = 0; i<repeat; i++) {
          oldAVX512VNNI_nobias += testOld_nobias<AVX512VNNI::Kernels8>(8, 256, 256);
          oldAVX512VNNI_nobias += testOld_nobias<AVX512VNNI::Kernels8>(8, 2048, 256);
          oldAVX512VNNI_nobias += testOld_nobias<AVX512VNNI::Kernels8>(320, 256, 256);
          oldAVX512VNNI_nobias += testOld_nobias<AVX512VNNI::Kernels8>(472, 256, 256);
          oldAVX512VNNI_nobias += testOld_nobias<AVX512VNNI::Kernels8>(248, 256, 256);
          oldAVX512VNNI_nobias += testOld_nobias<AVX512VNNI::Kernels8>(200, 256, 256);
  }

  std::cout << repeat << " iterations of AVX512VNNI without bias took: " << oldAVX512VNNI_nobias.count() << " seconds." << std::endl;

  std::chrono::duration<double> oldAVX512VNNI = testOld<AVX512BW::Kernels8>(1, 64, 8);
  for (int i = 0; i<repeat; i++) {
          oldAVX512VNNI += testOld<AVX512VNNI::Kernels8>(8, 256, 256);
          oldAVX512VNNI += testOld<AVX512VNNI::Kernels8>(8, 2048, 256);
          oldAVX512VNNI += testOld<AVX512VNNI::Kernels8>(320, 256, 256);
          oldAVX512VNNI += testOld<AVX512VNNI::Kernels8>(472, 256, 256);
          oldAVX512VNNI += testOld<AVX512VNNI::Kernels8>(248, 256, 256);
          oldAVX512VNNI += testOld<AVX512VNNI::Kernels8>(200, 256, 256);
  }

  std::cout << repeat << " iterations of AVX512VNNI took: " << oldAVX512VNNI.count() << " seconds." << std::endl;

  std::chrono::duration<double> newTimeAVX512VNNI = testOld<AVX512BW::Kernels8>(1, 64, 8);
  for (int i = 0; i<repeat; i++) {
    newTimeAVX512VNNI += testNew<AVX512VNNI::Kernels8>(8, 256, 256);
    newTimeAVX512VNNI += testNew<AVX512VNNI::Kernels8>(8, 2048, 256);
    newTimeAVX512VNNI += testNew<AVX512VNNI::Kernels8>(320, 256, 256);
    newTimeAVX512VNNI += testNew<AVX512VNNI::Kernels8>(472, 256, 256);
    newTimeAVX512VNNI += testNew<AVX512VNNI::Kernels8>(248, 256, 256);
    newTimeAVX512VNNI += testNew<AVX512VNNI::Kernels8>(200, 256, 256);
  }

  std::cout << repeat << " iterations of Shifted AVX512VNNI took: " << newTimeAVX512VNNI.count() << " seconds." << std::endl;
#endif

}